

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::readBase64(MidiFile *this,istream *instream)

{
  ssize_t sVar1;
  void *__buf;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  string local_218;
  stringstream local_1f8 [8];
  stringstream stream;
  ostream local_1e8 [399];
  allocator<char> local_59;
  istreambuf_iterator<char,_std::char_traits<char>_> local_58;
  undefined1 local_48 [12];
  undefined1 local_38 [8];
  string base64data;
  istream *instream_local;
  MidiFile *this_local;
  
  base64data.field_2._8_8_ = instream;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_48,instream);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator(&local_58);
  std::allocator<char>::allocator();
  __end._M_c = local_58._M_c;
  __end._M_sbuf = local_58._M_sbuf;
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_48._0_8_;
  __beg._M_c = local_48._8_4_;
  __end._12_4_ = 0;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)local_38,__beg,__end,&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::stringstream::stringstream(local_1f8);
  base64Decode(&local_218,this,(string *)local_38);
  std::operator<<(local_1e8,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  sVar1 = read(this,(int)local_1f8,__buf,(size_t)local_58._M_sbuf);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  std::__cxx11::string::~string((string *)local_38);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool MidiFile::readBase64(std::istream& instream) {
	std::string base64data((std::istreambuf_iterator<char>(instream)),
			std::istreambuf_iterator<char>());
	std::stringstream stream;
	stream << MidiFile::base64Decode(base64data);
	return MidiFile::read(stream);
}